

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t icu_63::spanOneUTF8(UnicodeSet *set,uint8_t *s,int32_t length)

{
  int iVar1;
  UBool UVar2;
  int iVar3;
  int local_34;
  byte local_2d;
  int local_2c;
  uint uStack_28;
  uint8_t __t;
  int32_t i;
  UChar32 c;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSet *set_local;
  
  if ((*s & 0x80) == 0) {
    UVar2 = UnicodeSet::contains(set,(uint)*s);
    if (UVar2 == '\0') {
      return -1;
    }
    return 1;
  }
  iVar3 = 1;
  local_2c = 1;
  uStack_28 = (uint)*s;
  if ((*s & 0x80) == 0) goto LAB_00397d1c;
  iVar1 = iVar3;
  if (length != 1) {
    iVar1 = local_2c;
    if (uStack_28 < 0xe0) {
      if (0xc1 < uStack_28) {
        uStack_28 = uStack_28 & 0x1f;
LAB_00397cd5:
        iVar1 = local_2c;
        if ((byte)(s[local_2c] + 0x80) < 0x40) {
          uStack_28 = uStack_28 << 6 | (uint)(byte)(s[local_2c] + 0x80);
          iVar3 = local_2c + 1;
          goto LAB_00397d1c;
        }
      }
    }
    else if (uStack_28 < 0xf0) {
      uStack_28 = uStack_28 & 0xf;
      if (((int)" 000000000000\x1000"[(int)uStack_28] & 1 << (sbyte)((int)(uint)s[1] >> 5)) != 0) {
        local_2d = s[1] & 0x3f;
        local_2c = iVar3;
LAB_00397c9c:
        uStack_28 = uStack_28 << 6 | (uint)local_2d;
        local_2c = local_2c + 1;
        iVar1 = local_2c;
        if (local_2c != length) goto LAB_00397cd5;
      }
    }
    else {
      iVar3 = uStack_28 - 0xf0;
      if ((iVar3 < 5) && (((int)""[(int)(uint)s[1] >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
        uStack_28 = iVar3 * 0x40 | s[1] & 0x3f;
        local_2c = 2;
        iVar1 = local_2c;
        if ((length != 2) && (local_2d = s[2] + 0x80, local_2c = 2, local_2d < 0x40))
        goto LAB_00397c9c;
      }
    }
  }
  local_2c = iVar1;
  uStack_28 = 0xfffd;
  iVar3 = local_2c;
LAB_00397d1c:
  local_2c = iVar3;
  UVar2 = UnicodeSet::contains(set,uStack_28);
  if (UVar2 == '\0') {
    local_34 = -local_2c;
  }
  else {
    local_34 = local_2c;
  }
  return local_34;
}

Assistant:

static inline int32_t
spanOneUTF8(const UnicodeSet &set, const uint8_t *s, int32_t length) {
    UChar32 c=*s;
    if(U8_IS_SINGLE(c)) {
        return set.contains(c) ? 1 : -1;
    }
    // Take advantage of non-ASCII fastpaths in U8_NEXT_OR_FFFD().
    int32_t i=0;
    U8_NEXT_OR_FFFD(s, i, length, c);
    return set.contains(c) ? i : -i;
}